

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartType.cpp
# Opt level: O2

bool Imf_2_5::isSupportedType(string *name)

{
  __type _Var1;
  
  _Var1 = std::operator==(name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               SCANLINEIMAGE_abi_cxx11_);
  if (!_Var1) {
    _Var1 = std::operator==(name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)TILEDIMAGE_abi_cxx11_);
    if (!_Var1) {
      _Var1 = std::operator==(name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)DEEPSCANLINE_abi_cxx11_);
      if (!_Var1) {
        _Var1 = std::operator==(name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)DEEPTILE_abi_cxx11_);
        return _Var1;
      }
    }
  }
  return true;
}

Assistant:

bool isSupportedType(const string& name)
{
    return (name == SCANLINEIMAGE || name == TILEDIMAGE ||
            name == DEEPSCANLINE || name == DEEPTILE);
}